

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib.c
# Opt level: O0

int parse_canframe(char *cs,cu_t *cu)

{
  uint uVar1;
  byte bVar2;
  size_t sVar3;
  int iVar4;
  uint *in_RSI;
  char *in_RDI;
  uchar dlc;
  canid_t tmp;
  __u8 *data;
  int mtu;
  int maxdlen;
  int len;
  int dlen;
  int idx;
  int i;
  uint *local_38;
  int local_30;
  int local_2c;
  int local_24;
  int local_20;
  int local_1c;
  int local_4;
  
  local_2c = 8;
  local_30 = 0x10;
  local_38 = in_RSI + 2;
  sVar3 = strlen(in_RDI);
  memset(in_RSI,0,0x810);
  if ((int)sVar3 < 4) {
    local_4 = 0;
  }
  else {
    if (in_RDI[3] == '#') {
      local_20 = 4;
      for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
        bVar2 = asc2nibble(in_RDI[local_1c]);
        if (0xf < bVar2) {
          return 0;
        }
        *in_RSI = (uint)bVar2 << (('\x02' - (char)local_1c) * '\x04' & 0x1fU) | *in_RSI;
      }
    }
    else if (in_RDI[5] == '#') {
      local_20 = 6;
      for (local_1c = 0; local_1c < 5; local_1c = local_1c + 1) {
        bVar2 = asc2nibble(in_RDI[local_1c]);
        if (0xf < bVar2) {
          return 0;
        }
        *in_RSI = (uint)bVar2 << (('\x04' - (char)local_1c) * '\x04' & 0x1fU) | *in_RSI;
      }
      uVar1 = *in_RSI;
      *in_RSI = *in_RSI & 0x7ff;
      *in_RSI = (uVar1 & 0xff000) << 4 | *in_RSI;
    }
    else {
      if (in_RDI[8] != '#') {
        return 0;
      }
      local_20 = 9;
      for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
        bVar2 = asc2nibble(in_RDI[local_1c]);
        if (0xf < bVar2) {
          return 0;
        }
        *in_RSI = (uint)bVar2 << (('\a' - (char)local_1c) * '\x04' & 0x1fU) | *in_RSI;
      }
      if ((*in_RSI & 0x20000000) == 0) {
        *in_RSI = *in_RSI | 0x80000000;
      }
    }
    if ((in_RDI[local_20] == 'R') || (in_RDI[local_20] == 'r')) {
      *in_RSI = *in_RSI | 0x40000000;
      if (in_RDI[local_20 + 1] != '\0') {
        bVar2 = asc2nibble(in_RDI[local_20 + 1]);
        if ((((bVar2 < 9) && (*(byte *)(in_RSI + 1) = bVar2, bVar2 == 8)) &&
            (in_RDI[local_20 + 2] == '_')) &&
           ((bVar2 = asc2nibble(in_RDI[local_20 + 3]), 8 < bVar2 && (bVar2 < 0x10)))) {
          *(byte *)((long)in_RSI + 7) = bVar2;
        }
      }
      local_4 = 0x10;
    }
    else {
      if (in_RDI[local_20] == '#') {
        local_2c = 0x40;
        local_30 = 0x48;
        bVar2 = asc2nibble(in_RDI[local_20 + 1]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)((long)in_RSI + 5) = bVar2;
        *(byte *)((long)in_RSI + 5) = *(byte *)((long)in_RSI + 5) | 4;
        local_20 = local_20 + 2;
      }
      else if (in_RDI[local_20 + 0xe] == '#') {
        local_2c = 0x800;
        local_30 = 0x80c;
        local_38 = in_RSI + 3;
        if ((in_RDI[local_20 + 2] != ':') || (in_RDI[local_20 + 5] != ':')) {
          return 0;
        }
        bVar2 = asc2nibble(in_RDI[local_20]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)(in_RSI + 1) = bVar2 << 4;
        bVar2 = asc2nibble(in_RDI[local_20 + 1]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)(in_RSI + 1) = (byte)in_RSI[1] | bVar2;
        *(byte *)(in_RSI + 1) = (byte)in_RSI[1] | 0x80;
        bVar2 = asc2nibble(in_RDI[local_20 + 3]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)((long)in_RSI + 5) = bVar2 << 4;
        bVar2 = asc2nibble(in_RDI[local_20 + 4]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)((long)in_RSI + 5) = *(byte *)((long)in_RSI + 5) | bVar2;
        local_20 = local_20 + 6;
        for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
          bVar2 = asc2nibble(in_RDI[local_20]);
          if (0xf < bVar2) {
            return 0;
          }
          in_RSI[2] = (uint)bVar2 << (('\a' - (char)local_1c) * '\x04' & 0x1fU) | in_RSI[2];
          local_20 = local_20 + 1;
        }
        local_20 = local_20 + 1;
      }
      local_24 = 0;
      for (local_1c = 0; local_1c < local_2c; local_1c = local_1c + 1) {
        if (in_RDI[local_20] == '.') {
          local_20 = local_20 + 1;
        }
        if ((int)sVar3 <= local_20) break;
        iVar4 = local_20 + 1;
        bVar2 = asc2nibble(in_RDI[local_20]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)((long)local_38 + (long)local_1c) = bVar2 << 4;
        local_20 = local_20 + 2;
        bVar2 = asc2nibble(in_RDI[iVar4]);
        if (0xf < bVar2) {
          return 0;
        }
        *(byte *)((long)local_38 + (long)local_1c) =
             *(byte *)((long)local_38 + (long)local_1c) | bVar2;
        local_24 = local_24 + 1;
      }
      if (local_30 == 0x80c) {
        *(short *)((long)in_RSI + 6) = (short)local_24;
      }
      else {
        *(char *)(in_RSI + 1) = (char)local_24;
      }
      if ((((local_2c == 8) && (local_24 == 8)) && (in_RDI[local_20] == '_')) &&
         ((bVar2 = asc2nibble(in_RDI[local_20 + 1]), 8 < bVar2 && (bVar2 < 0x10)))) {
        *(byte *)((long)in_RSI + 7) = bVar2;
      }
      local_4 = local_30;
    }
  }
  return local_4;
}

Assistant:

int parse_canframe(char *cs, cu_t *cu)
{
	/* documentation see lib.h */

	int i, idx, dlen, len;
	int maxdlen = CAN_MAX_DLEN;
	int mtu = CAN_MTU;
	__u8 *data = cu->fd.data; /* fill CAN CC/FD data by default */
	canid_t tmp;

	len = strlen(cs);
	//printf("'%s' len %d\n", cs, len);

	memset(cu, 0, sizeof(*cu)); /* init CAN CC/FD/XL frame, e.g. LEN = 0 */

	if (len < 4)
		return 0;

	if (cs[3] == CANID_DELIM) { /* 3 digits SFF */

		idx = 4;
		for (i = 0; i < 3; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (2 - i) * 4;
		}

	} else if (cs[5] == CANID_DELIM) { /* 5 digits CAN XL VCID/PRIO*/

		idx = 6;
		for (i = 0; i < 5; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->xl.prio |= tmp << (4 - i) * 4;
		}

		/* the VCID starts at bit position 16 */
		tmp = (cu->xl.prio << 4) & CANXL_VCID_MASK;
		cu->xl.prio &= CANXL_PRIO_MASK;
		cu->xl.prio |= tmp;

	} else if (cs[8] == CANID_DELIM) { /* 8 digits EFF */

		idx = 9;
		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[i])) > 0x0F)
				return 0;
			cu->cc.can_id |= tmp << (7 - i) * 4;
		}
		if (!(cu->cc.can_id & CAN_ERR_FLAG)) /* 8 digits but no errorframe?  */
			cu->cc.can_id |= CAN_EFF_FLAG;   /* then it is an extended frame */

	} else
		return 0;

	if ((cs[idx] == 'R') || (cs[idx] == 'r')) { /* RTR frame */
		cu->cc.can_id |= CAN_RTR_FLAG;

		/* check for optional DLC value for CAN 2.0B frames */
		if (cs[++idx] && (tmp = asc2nibble(cs[idx++])) <= CAN_MAX_DLEN) {
			cu->cc.len = tmp;

			/* check for optional raw DLC value for CAN 2.0B frames */
			if ((tmp == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
				tmp = asc2nibble(cs[idx]);
				if ((tmp > CAN_MAX_DLEN) && (tmp <= CAN_MAX_RAW_DLC))
					cu->cc.len8_dlc = tmp;
			}
		}
		return mtu;
	}

	if (cs[idx] == CANID_DELIM) { /* CAN FD frame escape char '##' */
		maxdlen = CANFD_MAX_DLEN;
		mtu = CANFD_MTU;

		/* CAN FD frame <canid>##<flags><data>* */
		if ((tmp = asc2nibble(cs[idx + 1])) > 0x0F)
			return 0;

		cu->fd.flags = tmp;
		cu->fd.flags |= CANFD_FDF; /* dual-use */
		idx += 2;

	} else if (cs[idx + 14] == CANID_DELIM) { /* CAN XL frame '#80:00:11223344#' */
		maxdlen = CANXL_MAX_DLEN;
		mtu = CANXL_MTU;
		data = cu->xl.data; /* fill CAN XL data */

		if ((cs[idx + 2] != XL_HDR_DELIM) || (cs[idx + 5] != XL_HDR_DELIM))
			return 0;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.flags |= tmp;

		/* force CAN XL flag if it was missing in the ASCII string */
		cu->xl.flags |= CANXL_XLF;

		idx++; /* skip XL_HDR_DELIM */

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		cu->xl.sdt |= tmp;

		idx++; /* skip XL_HDR_DELIM */

		for (i = 0; i < 8; i++) {
			if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
				return 0;
			cu->xl.af |= tmp << (7 - i) * 4;
		}

		idx++; /* skip CANID_DELIM */
	}

	for (i = 0, dlen = 0; i < maxdlen; i++) {
		if (cs[idx] == DATA_SEPERATOR) /* skip (optional) separator */
			idx++;

		if (idx >= len) /* end of string => end of data */
			break;

		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] = tmp << 4;
		if ((tmp = asc2nibble(cs[idx++])) > 0x0F)
			return 0;
		data[i] |= tmp;
		dlen++;
	}

	if (mtu == CANXL_MTU)
		cu->xl.len = dlen;
	else
		cu->fd.len = dlen;

	/* check for extra DLC when having a Classic CAN with 8 bytes payload */
	if ((maxdlen == CAN_MAX_DLEN) && (dlen == CAN_MAX_DLEN) && (cs[idx++] == CC_DLC_DELIM)) {
		unsigned char dlc = asc2nibble(cs[idx]);

		if ((dlc > CAN_MAX_DLEN) && (dlc <= CAN_MAX_RAW_DLC))
			cu->cc.len8_dlc = dlc;
	}

	return mtu;
}